

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O0

void __thiscall Assimp::Collada::Light::Light(Light *this)

{
  Light *this_local;
  
  this->mType = 0;
  aiColor3D::aiColor3D(&this->mColor);
  this->mAttConstant = 1.0;
  this->mAttLinear = 0.0;
  this->mAttQuadratic = 0.0;
  this->mFalloffAngle = 180.0;
  this->mFalloffExponent = 0.0;
  this->mPenumbraAngle = 1e+09;
  this->mOuterAngle = 1e+09;
  this->mIntensity = 1.0;
  return;
}

Assistant:

Light()
        :   mType            (aiLightSource_UNDEFINED)
        ,   mAttConstant     (1.f)
        ,   mAttLinear       (0.f)
        ,   mAttQuadratic    (0.f)
        ,   mFalloffAngle    (180.f)
        ,   mFalloffExponent (0.f)
        ,   mPenumbraAngle   (ASSIMP_COLLADA_LIGHT_ANGLE_NOT_SET)
        ,   mOuterAngle      (ASSIMP_COLLADA_LIGHT_ANGLE_NOT_SET)
        ,   mIntensity       (1.f)
    {}